

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDocPtr xmlCopyDoc(xmlDocPtr doc,int recursive)

{
  char *pcVar1;
  xmlChar *pxVar2;
  xmlDtdPtr pxVar3;
  xmlNsPtr pxVar4;
  xmlNodePtr pxVar5;
  _xmlNode *local_30;
  xmlNodePtr tmp;
  xmlDocPtr ret;
  int recursive_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = xmlNewDoc(doc->version);
    if (doc_local == (xmlDocPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local->type = doc->type;
      if (doc->name != (char *)0x0) {
        pcVar1 = (*xmlMemStrdup)(doc->name);
        doc_local->name = pcVar1;
      }
      if (doc->encoding != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(doc->encoding);
        doc_local->encoding = pxVar2;
      }
      if (doc->URL != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(doc->URL);
        doc_local->URL = pxVar2;
      }
      doc_local->charset = doc->charset;
      doc_local->compression = doc->compression;
      doc_local->standalone = doc->standalone;
      if (recursive != 0) {
        doc_local->last = (_xmlNode *)0x0;
        doc_local->children = (_xmlNode *)0x0;
        if (doc->intSubset != (_xmlDtd *)0x0) {
          pxVar3 = xmlCopyDtd(doc->intSubset);
          doc_local->intSubset = pxVar3;
          if (doc_local->intSubset == (_xmlDtd *)0x0) {
            xmlFreeDoc(doc_local);
            return (xmlDocPtr)0x0;
          }
          xmlSetTreeDoc((xmlNodePtr)doc_local->intSubset,doc_local);
          doc_local->intSubset->parent = doc_local;
        }
        if (doc->oldNs != (_xmlNs *)0x0) {
          pxVar4 = xmlCopyNamespaceList(doc->oldNs);
          doc_local->oldNs = pxVar4;
        }
        if (doc->children != (_xmlNode *)0x0) {
          pxVar5 = xmlStaticCopyNodeList(doc->children,doc_local,(xmlNodePtr)doc_local);
          doc_local->children = pxVar5;
          doc_local->last = (_xmlNode *)0x0;
          for (local_30 = doc_local->children; local_30 != (_xmlNode *)0x0;
              local_30 = local_30->next) {
            if (local_30->next == (_xmlNode *)0x0) {
              doc_local->last = local_30;
            }
          }
        }
      }
    }
  }
  return doc_local;
}

Assistant:

xmlDocPtr
xmlCopyDoc(xmlDocPtr doc, int recursive) {
    xmlDocPtr ret;

    if (doc == NULL) return(NULL);
    ret = xmlNewDoc(doc->version);
    if (ret == NULL) return(NULL);
    ret->type = doc->type;
    if (doc->name != NULL)
        ret->name = xmlMemStrdup(doc->name);
    if (doc->encoding != NULL)
        ret->encoding = xmlStrdup(doc->encoding);
    if (doc->URL != NULL)
        ret->URL = xmlStrdup(doc->URL);
    ret->charset = doc->charset;
    ret->compression = doc->compression;
    ret->standalone = doc->standalone;
    if (!recursive) return(ret);

    ret->last = NULL;
    ret->children = NULL;
#ifdef LIBXML_TREE_ENABLED
    if (doc->intSubset != NULL) {
        ret->intSubset = xmlCopyDtd(doc->intSubset);
	if (ret->intSubset == NULL) {
	    xmlFreeDoc(ret);
	    return(NULL);
	}
	xmlSetTreeDoc((xmlNodePtr)ret->intSubset, ret);
	ret->intSubset->parent = ret;
    }
#endif
    if (doc->oldNs != NULL)
        ret->oldNs = xmlCopyNamespaceList(doc->oldNs);
    if (doc->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(doc->children, ret,
		                               (xmlNodePtr)ret);
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    return(ret);
}